

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

int luaO_utf8esc(char *buff,unsigned_long x)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if (x < 0x80) {
    iVar1 = 1;
    lVar2 = 7;
  }
  else {
    uVar3 = 0x3f;
    lVar2 = 0x700000000;
    lVar4 = 0;
    do {
      lVar2 = lVar2 + -0x100000000;
      buff[lVar4 + 7] = (byte)x & 0x3f | 0x80;
      x = x >> 6;
      uVar3 = uVar3 >> 1;
      lVar4 = lVar4 + -1;
    } while (uVar3 < x);
    iVar1 = 1 - (int)lVar4;
    x = x | ~(uint)uVar3 * 2;
    lVar2 = lVar2 >> 0x20;
  }
  buff[lVar2] = (char)x;
  return iVar1;
}

Assistant:

int luaO_utf8esc (char *buff, unsigned long x) {
  int n = 1;  /* number of bytes put in buffer (backwards) */
  lua_assert(x <= 0x10FFFF);
  if (x < 0x80)  /* ascii? */
    buff[UTF8BUFFSZ - 1] = cast(char, x);
  else {  /* need continuation bytes */
    unsigned int mfb = 0x3f;  /* maximum that fits in first byte */
    do {  /* add continuation bytes */
      buff[UTF8BUFFSZ - (n++)] = cast(char, 0x80 | (x & 0x3f));
      x >>= 6;  /* remove added bits */
      mfb >>= 1;  /* now there is one less bit available in first byte */
    } while (x > mfb);  /* still needs continuation byte? */
    buff[UTF8BUFFSZ - n] = cast(char, (~mfb << 1) | x);  /* add first byte */
  }
  return n;
}